

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrCreatePassthroughLayerFB
                   (XrSession session,XrPassthroughLayerCreateInfoFB *createInfo,
                   XrPassthroughLayerFB *outLayer)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> handle_info
  ;
  
  pVar2 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session);
  XVar1 = (*(pVar2.second)->dispatch_table->CreatePassthroughLayerFB)(session,createInfo,outLayer);
  if ((outLayer != (XrPassthroughLayerFB *)0x0) && (XVar1 == XR_SUCCESS)) {
    handle_info._M_t.
    super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
    ._M_t.
    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl =
         (__uniq_ptr_data<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>,_true,_true>
          )operator_new(0x18);
    *(long *)handle_info._M_t.
             super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
             .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = 0;
    *(long *)((long)handle_info._M_t.
                    super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
                    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8) = 0
    ;
    *(GenValidUsageXrInstanceInfo **)
     handle_info._M_t.
     super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
     ._M_t.
     super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
     .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = pVar2.second;
    *(undefined4 *)
     ((long)handle_info._M_t.
            super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
            .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8) = 2;
    *(XrSession *)
     ((long)handle_info._M_t.
            super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
            .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 0x10) =
         session;
    HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>::insert
              (&g_passthroughlayerfb_info.
                super_HandleInfoBase<XrPassthroughLayerFB_T_*,_GenValidUsageXrHandleInfo>,*outLayer,
               &handle_info);
    std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>::
    ~unique_ptr(&handle_info);
    XVar1 = XR_SUCCESS;
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrCreatePassthroughLayerFB(
    XrSession session,
    const XrPassthroughLayerCreateInfoFB* createInfo,
    XrPassthroughLayerFB* outLayer) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->CreatePassthroughLayerFB(session, createInfo, outLayer);
        if (XR_SUCCESS == result && nullptr != outLayer) {
            std::unique_ptr<GenValidUsageXrHandleInfo> handle_info(new GenValidUsageXrHandleInfo());
            handle_info->instance_info = gen_instance_info;
            handle_info->direct_parent_type = XR_OBJECT_TYPE_SESSION;
            handle_info->direct_parent_handle = MakeHandleGeneric(session);
            g_passthroughlayerfb_info.insert(*outLayer, std::move(handle_info));
        }
    } catch (std::bad_alloc&) {
        result = XR_ERROR_OUT_OF_MEMORY;
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}